

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall TokenStream::next(Token *__return_storage_ptr__,TokenStream *this)

{
  char cVar1;
  undefined3 uVar2;
  bool bVar3;
  Token *pTVar4;
  TokenStream *this_local;
  
  bVar3 = std::optional::operator_cast_to_bool((optional *)&this->stash);
  if (bVar3) {
    pTVar4 = std::optional<Token>::value(&this->stash);
    (__return_storage_ptr__->span).begin = (pTVar4->span).begin;
    (__return_storage_ptr__->span).end = (pTVar4->span).end;
    cVar1 = pTVar4->value;
    uVar2 = *(undefined3 *)&pTVar4->field_0x15;
    __return_storage_ptr__->type = pTVar4->type;
    __return_storage_ptr__->value = cVar1;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uVar2;
    std::optional<Token>::operator=(&this->stash);
  }
  else {
    std::function<Token_()>::operator()(__return_storage_ptr__,&this->supplier);
  }
  return __return_storage_ptr__;
}

Assistant:

auto TokenStream::next() -> Token {
    if (!stash)
        return supplier();

    auto temp = stash.value();
    stash = std::nullopt;
    return temp;
}